

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

bool ImGui::SFML::UpdateFontTexture(void)

{
  bool bVar1;
  uint uVar2;
  ImGuiIO *pIVar3;
  Texture *this;
  uchar *pixels;
  int height;
  int width;
  Uint8 *local_38;
  uint local_30;
  uint local_2c;
  
  if ((anonymous_namespace)::s_currWindowCtx != 0) {
    pIVar3 = GetIO();
    ImFontAtlas::GetTexDataAsRGBA32
              (pIVar3->Fonts,&local_38,(int *)&local_2c,(int *)&local_30,(int *)0x0);
    this = (Texture *)((anonymous_namespace)::s_currWindowCtx + 0x10);
    bVar1 = sf::Texture::create(this,local_2c,local_30);
    if (bVar1) {
      sf::Texture::update(this,local_38);
      uVar2 = sf::Texture::getNativeHandle(this);
      pIVar3->Fonts->TexID = (ImTextureID)(ulong)uVar2;
    }
    return bVar1;
  }
  __assert_fail("s_currWindowCtx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                ,0x235,"bool ImGui::SFML::UpdateFontTexture()");
}

Assistant:

bool UpdateFontTexture() {
    assert(s_currWindowCtx);

    ImGuiIO& io = ImGui::GetIO();
    unsigned char* pixels;
    int width, height;

    io.Fonts->GetTexDataAsRGBA32(&pixels, &width, &height);

    sf::Texture& texture = s_currWindowCtx->fontTexture;
    if (!texture.create(width, height)) {
        return false;
    }

    texture.update(pixels);

    ImTextureID texID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());
    io.Fonts->SetTexID(texID);

    return true;
}